

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_init(char *cfg)

{
  char cVar1;
  char *pcVar2;
  fsnav_imu *pfVar3;
  fsnav_gnss *pfVar4;
  fsnav_air *pfVar5;
  fsnav_ref *pfVar6;
  ulong local_58;
  size_t i;
  fsnav_gnss *reallocated_pointer;
  char *cfgptr;
  size_t grouplen;
  size_t multi_gnss_index_position;
  char cStack_24;
  undefined2 uStack_23;
  char multi_gnss_token [9];
  size_t max_gnss_count;
  char *cfg_local;
  
  multi_gnss_token[1] = '\n';
  multi_gnss_token[2] = '\0';
  multi_gnss_token[3] = '\0';
  multi_gnss_token[4] = '\0';
  multi_gnss_token[5] = '\0';
  multi_gnss_token[6] = '\0';
  multi_gnss_token[7] = '\0';
  multi_gnss_token[8] = '\0';
  stack0xffffffffffffffd7 = 0x3a5d305b73736e67;
  multi_gnss_token[0] = '\0';
  grouplen = 5;
  fsnav->cfglength = 0;
  while (cfg[fsnav->cfglength] != '\0') {
    fsnav->cfglength = fsnav->cfglength + 1;
  }
  pcVar2 = (char *)malloc(fsnav->cfglength + 1);
  fsnav->cfg = pcVar2;
  if (fsnav->cfg == (char *)0x0) {
    return '\0';
  }
  for (local_58 = 0; local_58 < fsnav->cfglength; local_58 = local_58 + 1) {
    fsnav->cfg[local_58] = cfg[local_58];
  }
  fsnav->cfg[fsnav->cfglength] = '\0';
  fsnav->cfg_settings = (char *)0x0;
  fsnav->settings_length = 0;
  fsnav_locatecfggroup("",fsnav->cfg,fsnav->cfglength,&fsnav->cfg_settings,&fsnav->settings_length);
  fsnav_init_imu_const();
  fsnav->imu = (fsnav_imu *)0x0;
  cVar1 = fsnav_locatecfggroup
                    ("imu:",fsnav->cfg,fsnav->cfglength,(char **)&reallocated_pointer,
                     (size_t *)&cfgptr);
  if (cVar1 != '\0') {
    pfVar3 = (fsnav_imu *)calloc(1,0x200);
    fsnav->imu = pfVar3;
    if (fsnav->imu == (fsnav_imu *)0x0) {
      fsnav_free();
      return '\0';
    }
    fsnav->imu->cfg = (char *)reallocated_pointer;
    fsnav->imu->cfglength = (size_t)cfgptr;
    cVar1 = fsnav_init_imu(fsnav->imu);
    if (cVar1 == '\0') {
      fsnav_free();
      return '\0';
    }
  }
  fsnav_init_gnss_const();
  fsnav->gnss = (fsnav_gnss *)0x0;
  fsnav->gnss_count = 0;
  for (local_58 = 0; local_58 < 10; local_58 = local_58 + 1) {
    stack0xffffffffffffffd7 = CONCAT15((char)local_58 + '0',stack0xffffffffffffffd7);
    if (((local_58 == 0) &&
        (cVar1 = fsnav_locatecfggroup
                           ("gnss:",fsnav->cfg,fsnav->cfglength,(char **)&reallocated_pointer,
                            (size_t *)&cfgptr), cVar1 != '\0')) ||
       (cVar1 = fsnav_locatecfggroup
                          ((char *)((long)&multi_gnss_index_position + 7),fsnav->cfg,
                           fsnav->cfglength,(char **)&reallocated_pointer,(size_t *)&cfgptr),
       cVar1 != '\0')) {
      if (fsnav->gnss_count <= local_58) {
        pfVar4 = (fsnav_gnss *)realloc(fsnav->gnss,(local_58 + 1) * 0x1d8);
        if (pfVar4 == (fsnav_gnss *)0x0) {
          fsnav_free();
          return '\0';
        }
        fsnav->gnss = pfVar4;
        while (fsnav->gnss_count < local_58) {
          fsnav->gnss[fsnav->gnss_count].cfg = (char *)0x0;
          fsnav->gnss[fsnav->gnss_count].cfglength = 0;
          fsnav_init_gnss(fsnav->gnss + fsnav->gnss_count);
          fsnav->gnss_count = fsnav->gnss_count + 1;
        }
        fsnav->gnss_count = local_58 + 1;
      }
      fsnav->gnss[local_58].cfg = (char *)reallocated_pointer;
      fsnav->gnss[local_58].cfglength = (size_t)cfgptr;
      cVar1 = fsnav_init_gnss(fsnav->gnss + local_58);
      if (cVar1 == '\0') {
        fsnav_free();
        return '\0';
      }
    }
  }
  fsnav->air = (fsnav_air *)0x0;
  cVar1 = fsnav_locatecfggroup
                    ("air:",fsnav->cfg,fsnav->cfglength,(char **)&reallocated_pointer,
                     (size_t *)&cfgptr);
  if (cVar1 != '\0') {
    pfVar5 = (fsnav_air *)calloc(1,0x60);
    fsnav->air = pfVar5;
    if (fsnav->air == (fsnav_air *)0x0) {
      fsnav_free();
      return '\0';
    }
    fsnav->air->cfg = (char *)reallocated_pointer;
    fsnav->air->cfglength = (size_t)cfgptr;
    cVar1 = fsnav_init_air(fsnav->air);
    if (cVar1 == '\0') {
      fsnav_free();
      return '\0';
    }
  }
  fsnav->ref = (fsnav_ref *)0x0;
  cVar1 = fsnav_locatecfggroup
                    ("ref:",fsnav->cfg,fsnav->cfglength,(char **)&reallocated_pointer,
                     (size_t *)&cfgptr);
  if (cVar1 != '\0') {
    pfVar6 = (fsnav_ref *)calloc(1,0x160);
    fsnav->ref = pfVar6;
    if (fsnav->ref == (fsnav_ref *)0x0) {
      fsnav_free();
      return '\0';
    }
    fsnav->ref->cfg = (char *)reallocated_pointer;
    fsnav->ref->cfglength = (size_t)cfgptr;
    cVar1 = fsnav_init_ref(fsnav->ref);
    if (cVar1 == '\0') {
      fsnav_free();
      return '\0';
    }
  }
  cVar1 = fsnav_init_sol(&fsnav->sol,fsnav->cfg_settings,fsnav->settings_length);
  if (cVar1 != '\0') {
    fsnav->t = 0.0;
    fsnav->mode = 0;
  }
  else {
    fsnav_free();
  }
  return cVar1 != '\0';
}

Assistant:

char fsnav_init(char* cfg)
{
	const size_t max_gnss_count = 10; // maximum number of gnss receiver data structures

	char multi_gnss_token[] = "gnss[0]:";
	const size_t multi_gnss_index_position = 5;

	size_t grouplen;
	char* cfgptr;

	fsnav_gnss* reallocated_pointer;

	size_t i;

	// determine configuration string length
	for (fsnav->cfglength = 0; cfg[fsnav->cfglength]; fsnav->cfglength++);

	// assign configuration string
	fsnav->cfg = (char*)malloc(sizeof(char)*(fsnav->cfglength+1));
	if (fsnav->cfg == NULL)
		return 0;
	for (i = 0; i < fsnav->cfglength; i++)
		fsnav->cfg[i] = cfg[i];
	fsnav->cfg[fsnav->cfglength] = '\0';

	// fetch a part of configuration that is outside of any group
	fsnav->cfg_settings = NULL;
	fsnav->settings_length = 0;
	fsnav_locatecfggroup("", fsnav->cfg, fsnav->cfglength, &fsnav->cfg_settings, &fsnav->settings_length);

	// imu init
	fsnav_init_imu_const();
	fsnav->imu = NULL;
	if (fsnav_locatecfggroup("imu:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try to allocate memory
		fsnav->imu = (fsnav_imu*)calloc(1, sizeof(fsnav_imu));
		if (fsnav->imu == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->imu->cfg = cfgptr;
		fsnav->imu->cfglength = grouplen;

		// try to init
		if (!fsnav_init_imu(fsnav->imu)) {
			fsnav_free();
			return 0;
		}
	}

	// gnss init
	fsnav_init_gnss_const();
	fsnav->gnss = NULL;
	fsnav->gnss_count = 0;
	// multiple gnss mode support
	for (i = 0; i < max_gnss_count; i++) {
		multi_gnss_token[multi_gnss_index_position] = '0' + (char)i;

		if ((i == 0 && fsnav_locatecfggroup("gnss:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) ||
		     fsnav_locatecfggroup(multi_gnss_token, fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) {
			if (i >= fsnav->gnss_count) {
				// try to allocate/reallocate memory
				reallocated_pointer = (fsnav_gnss*)realloc(fsnav->gnss, sizeof(fsnav_gnss)*(i+1));
				if (reallocated_pointer == NULL) {
					fsnav_free();
					return 0;
				}
				else
					fsnav->gnss = reallocated_pointer;
				// try to init new instances, except the i-th one
				for (; fsnav->gnss_count < i; fsnav->gnss_count++) {
					fsnav->gnss[fsnav->gnss_count].cfg = NULL;
					fsnav->gnss[fsnav->gnss_count].cfglength = 0;
					fsnav_init_gnss(&(fsnav->gnss[fsnav->gnss_count]));
				}
				fsnav->gnss_count = i+1;
			}

			// set configuration pointer
			fsnav->gnss[i].cfg = cfgptr;
			fsnav->gnss[i].cfglength = grouplen;

			// try to init
			if (!fsnav_init_gnss(&(fsnav->gnss[i]))) {
				fsnav_free();
				return 0;
			}
		}
	}

	// air data init
	fsnav->air = NULL;
	if (fsnav_locatecfggroup("air:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try to allocate memory
		fsnav->air = (fsnav_air*)calloc(1, sizeof(fsnav_air));
		if (fsnav->air == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->air->cfg = cfgptr;
		fsnav->air->cfglength = grouplen;

		// try to init
		if (!fsnav_init_air(fsnav->air)) {
			fsnav_free();
			return 0;
		}
	}

	// reference data init
	fsnav->ref = NULL;
	if (fsnav_locatecfggroup("ref:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try lo allocate memory
		fsnav->ref = (fsnav_ref*)calloc(1, sizeof(fsnav_ref));
		if (fsnav->ref == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->ref->cfg = cfgptr;
		fsnav->ref->cfglength = grouplen;

		// try to init
		if(!fsnav_init_ref(fsnav->ref)) {
			fsnav_free();
			return 0;
		}
	}

	// solution
	if (!fsnav_init_sol(&(fsnav->sol), fsnav->cfg_settings, fsnav->settings_length)) {
		fsnav_free();
		return 0;
	}

	// system time, operation mode
	fsnav->t = 0;
	fsnav->mode = 0;
	return 1;
}